

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O3

void __thiscall libchars::token::token(token *this,type_t ttype_,id_t ID_,id_t vtype_,char *name_)

{
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->ttype = ttype_;
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  (this->help)._M_string_length = 0;
  (this->help).field_2._M_local_buf[0] = '\0';
  this->ID = ID_;
  this->status = 0;
  this->vtype = vtype_;
  this->offset = 0;
  this->length = 0;
  this->next = (token *)0x0;
  if (name_ != (char *)0x0) {
    strlen(name_);
    std::__cxx11::string::_M_replace((ulong)&this->name,0,(char *)0x0,(ulong)name_);
  }
  return;
}

Assistant:

token::token(type_t ttype_, id_t ID_, id_t vtype_, const char *name_) :
          ttype(ttype_),ID(ID_),
          status(0),vtype(vtype_),
          offset(0),length(0),
          next(NULL)
    {
        if (name_ != NULL)
            name.assign(name_);
    }